

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O3

MCodeChunk * jit_assemble(MCodeChunk *__return_storage_ptr__,Trace *trace)

{
  long lVar1;
  IrIns *pIVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  void *pvVar10;
  int iVar11;
  ulong extraout_RDX;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  ulong uVar15;
  char *__format;
  long lVar16;
  int reg;
  long lVar17;
  ushort uVar18;
  ushort uVar20;
  undefined1 auVar19 [16];
  IrRef reg_end [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar11 = trace->ir_count;
  pvVar10 = calloc((long)iVar11,2);
  uVar13 = (short)iVar11 - 1;
  uVar12 = extraout_RDX;
  if (uVar13 != 0) {
    pIVar2 = trace->ir;
    uVar12 = (ulong)uVar13;
    do {
      uVar15 = pIVar2[uVar12];
      if ((uVar15 & 0xff00) != 0) {
        uVar14 = uVar15 >> 0x10 & 0xffff;
        if (*(short *)((long)pvVar10 + uVar14 * 2) == 0) {
          *(short *)((long)pvVar10 + uVar14 * 2) = (short)uVar12;
        }
        uVar15 = uVar15 >> 0x20 & 0xffff;
        if (*(short *)((long)pvVar10 + uVar15 * 2) == 0) {
          *(short *)((long)pvVar10 + uVar15 * 2) = (short)uVar12;
        }
      }
      uVar12 = uVar12 - 1;
    } while ((short)uVar12 != 0);
  }
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (1 < iVar11) {
    pIVar2 = trace->ir;
    uVar12 = CONCAT62((int6)(uVar12 >> 0x10),1);
    do {
      uVar9 = (uint)uVar12;
      auVar19 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
      lVar16 = 0;
      do {
        lVar17 = lVar16 * 2;
        uVar13 = *(ushort *)(local_58 + lVar17 + 2);
        uVar3 = *(ushort *)(local_58 + lVar17 + 4);
        uVar4 = *(ushort *)(local_58 + lVar17 + 6);
        uVar5 = *(ushort *)(local_58 + lVar17 + 8);
        uVar6 = *(ushort *)(local_48 + lVar17 + -6);
        uVar7 = *(ushort *)(local_48 + lVar17 + -4);
        uVar8 = *(ushort *)(local_48 + lVar17 + -2);
        uVar18 = auVar19._0_2_;
        uVar20 = auVar19._2_2_;
        lVar1 = lVar16 * 2;
        *(ushort *)(local_58 + lVar1) =
             ~-(ushort)(*(ushort *)(local_58 + lVar17) == uVar18) & *(ushort *)(local_58 + lVar17);
        *(ushort *)(local_58 + lVar1 + 2) = ~-(ushort)(uVar13 == uVar20) & uVar13;
        *(ushort *)(local_58 + lVar1 + 4) = ~-(ushort)(uVar3 == uVar18) & uVar3;
        *(ushort *)(local_58 + lVar1 + 6) = ~-(ushort)(uVar4 == uVar20) & uVar4;
        *(ushort *)(local_58 + lVar1 + 8) = ~-(ushort)(uVar5 == uVar18) & uVar5;
        *(ushort *)(local_48 + lVar1 + -6) = ~-(ushort)(uVar6 == uVar20) & uVar6;
        *(ushort *)(local_48 + lVar1 + -4) = ~-(ushort)(uVar7 == uVar18) & uVar7;
        *(ushort *)(local_48 + lVar1 + -2) = ~-(ushort)(uVar8 == uVar20) & uVar8;
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x10);
      uVar12 = uVar12 & 0xffff;
      lVar17 = 0;
      lVar16 = 0;
      while (*(short *)(local_58 + lVar16 * 2) != 0) {
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + -0x1000000000000;
        if (lVar16 == 0x10) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/jit/asm/x64.c"
                        ,0x7a,"void asm_allocate_registers(Trace *)");
        }
      }
      pIVar2[uVar12] = (pIVar2[uVar12] & 0xffffffffffff) - lVar17;
      *(undefined2 *)(local_58 + lVar16 * 2) = *(undefined2 *)((long)pvVar10 + uVar12 * 2);
      uVar12 = (ulong)(uVar9 + 1);
    } while ((int)(uVar9 + 1 & 0xffff) < iVar11);
  }
  asm_new();
  if (1 < (uint)trace->ir_count) {
    uVar12 = 1;
    do {
      pIVar2 = trace->ir;
      uVar15 = pIVar2[uVar12];
      uVar9 = (uint)uVar15 & 0xffff;
      if (uVar9 == 0x100) {
        uVar14 = pIVar2[uVar15 >> 0x20 & 0xffff];
        if (uVar15 >> 0x30 != pIVar2[uVar15 >> 0x10 & 0xffff] >> 0x30) {
          printf("movsd xmm%d, xmm%d\n",uVar15 >> 0x30,pIVar2[uVar15 >> 0x10 & 0xffff] >> 0x30);
        }
        uVar14 = uVar14 >> 0x30;
        __format = "addsd xmm%d, xmm%d\n";
LAB_001136d3:
        printf(__format,uVar15 >> 0x30,uVar14);
      }
      else if (uVar9 == 1) {
        printf("movsd xmm%d, [0x%zx]\n",uVar15 >> 0x30,
               (uVar15 >> 0xd & 0x7fffffff8) + (long)trace->vm->consts);
      }
      else if ((uVar15 & 0xffff) == 0) {
        iVar11 = (int)(uVar15 >> 0x10);
        if (iVar11 != 0) {
          uVar14 = (ulong)(uint)(iVar11 << 3);
          __format = "movsd xmm%d, [rdx + 0x%x]\n";
          goto LAB_001136d3;
        }
        printf("movsd xmm%d, [rdx]\n",uVar15 >> 0x30);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(long)trace->ir_count);
  }
  return __return_storage_ptr__;
}

Assistant:

MCodeChunk jit_assemble(Trace *trace) {
	// Perform register allocation first
	asm_allocate_registers(trace);

	// Create an empty machine code chunk
	MCodeChunk chunk = asm_new();

	// Assemble the IR instruction by instruction
	for (size_t i = 1; i < trace->ir_count; i++) {
		asm_ins(&chunk, trace, trace->ir[i]);
	}

	return chunk;
}